

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-rasterize.c
# Opt level: O1

void plutovg_rasterize(plutovg_span_buffer_t *span_buffer,plutovg_path_t *path,
                      plutovg_matrix_t *matrix,plutovg_rect_t *clip_rect,
                      plutovg_stroke_data_t *stroke_data,plutovg_fill_rule_t winding)

{
  PVG_FT_Outline *__ptr;
  PVG_FT_Raster_Params params;
  PVG_FT_Raster_Params local_68;
  
  __ptr = ft_outline_convert(path,matrix,stroke_data);
  if ((stroke_data == (plutovg_stroke_data_t *)0x0) && (winding == PLUTOVG_FILL_RULE_EVEN_ODD)) {
    __ptr->flags = 2;
  }
  else {
    __ptr->flags = 0;
  }
  local_68.flags = 3;
  local_68.gray_spans = spans_generation_callback;
  if (clip_rect != (plutovg_rect_t *)0x0) {
    local_68.flags = 7;
    local_68.clip_box.xMin = (PVG_FT_Pos)clip_rect->x;
    local_68.clip_box.yMin = (PVG_FT_Pos)clip_rect->y;
    local_68.clip_box.xMax = (PVG_FT_Pos)(clip_rect->x + clip_rect->w);
    local_68.clip_box.yMax = (PVG_FT_Pos)(clip_rect->y + clip_rect->h);
  }
  (span_buffer->spans).size = 0;
  span_buffer->x = 0;
  span_buffer->y = 0;
  span_buffer->w = -1;
  span_buffer->h = -1;
  local_68.source = __ptr;
  local_68.user = span_buffer;
  PVG_FT_Raster_Render(&local_68);
  free(__ptr);
  return;
}

Assistant:

void plutovg_rasterize(plutovg_span_buffer_t* span_buffer, const plutovg_path_t* path, const plutovg_matrix_t* matrix, const plutovg_rect_t* clip_rect, const plutovg_stroke_data_t* stroke_data, plutovg_fill_rule_t winding)
{
    PVG_FT_Outline* outline = ft_outline_convert(path, matrix, stroke_data);
    if(stroke_data) {
        outline->flags = PVG_FT_OUTLINE_NONE;
    } else {
        switch(winding) {
        case PLUTOVG_FILL_RULE_EVEN_ODD:
            outline->flags = PVG_FT_OUTLINE_EVEN_ODD_FILL;
            break;
        default:
            outline->flags = PVG_FT_OUTLINE_NONE;
            break;
        }
    }

    PVG_FT_Raster_Params params;
    params.flags = PVG_FT_RASTER_FLAG_DIRECT | PVG_FT_RASTER_FLAG_AA;
    params.gray_spans = spans_generation_callback;
    params.user = span_buffer;
    params.source = outline;
    if(clip_rect) {
        params.flags |= PVG_FT_RASTER_FLAG_CLIP;
        params.clip_box.xMin = (PVG_FT_Pos)clip_rect->x;
        params.clip_box.yMin = (PVG_FT_Pos)clip_rect->y;
        params.clip_box.xMax = (PVG_FT_Pos)(clip_rect->x + clip_rect->w);
        params.clip_box.yMax = (PVG_FT_Pos)(clip_rect->y + clip_rect->h);
    }

    plutovg_span_buffer_reset(span_buffer);
    PVG_FT_Raster_Render(&params);
    ft_outline_destroy(outline);
}